

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O2

void __thiscall ZAP::Archive::buildLookupTable(Archive *this)

{
  uint uVar1;
  char c;
  uint32_t tableSize;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_88;
  Entry entry;
  string filename;
  
  std::istream::seekg(this->stream,4,0);
  local_88 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->lookupTable;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_88);
  tableSize = 0;
  anon_unknown.dwarf_172f2::readField<unsigned_int>(this->stream,&tableSize);
  for (uVar1 = 0; uVar1 < tableSize; uVar1 = uVar1 + 1) {
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
    filename._M_string_length = 0;
    filename.field_2._M_local_buf[0] = '\0';
    c = '\0';
    while( true ) {
      std::istream::read((char *)this->stream,(long)&c);
      if (c == '\0') break;
      std::__cxx11::string::push_back((char)&filename);
    }
    entry.virtual_path._M_dataplus._M_p = (pointer)&entry.virtual_path.field_2;
    entry.virtual_path._M_string_length = 0;
    entry.virtual_path.field_2._M_local_buf[0] = '\0';
    entry.index = 0;
    entry.decompressed_size = 0;
    entry.compressed_size = 0;
    std::__cxx11::string::_M_assign((string *)&entry);
    anon_unknown.dwarf_172f2::readField<unsigned_int>(this->stream,&entry.index);
    anon_unknown.dwarf_172f2::readField<unsigned_int>(this->stream,&entry.decompressed_size);
    anon_unknown.dwarf_172f2::readField<unsigned_int>(this->stream,&entry.compressed_size);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,ZAP::Archive::Entry&>(local_88,&filename,&entry);
    std::__cxx11::string::~string((string *)&entry);
    std::__cxx11::string::~string((string *)&filename);
  }
  return;
}

Assistant:

void Archive::buildLookupTable()
	{
		// We assume that stream is open
		stream->seekg(TABLE_POS);
		lookupTable.clear();

		std::uint32_t tableSize = 0;
		readField(stream, &tableSize);

		for (uint32_t i = 0; i < tableSize; ++i)
		{
			std::string filename;

			char c = '\0';
			for(;;)
			{
				stream->read(&c, 1);

				if (c == '\0')
					break;

				filename += c;
			}

			Entry entry {};
			entry.virtual_path = filename;
			readField(stream, &entry.index);
			readField(stream, &entry.decompressed_size);
			readField(stream, &entry.compressed_size);

			lookupTable.emplace(filename, entry);
		}
	}